

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCmp.h
# Opt level: O0

void __thiscall NaPNComparator::~NaPNComparator(NaPNComparator *this)

{
  NaPetriNode *in_RDI;
  
  *(code **)in_RDI = NaPNBus3i1o::NaPNBus3i1o;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(in_RDI + 0xd8));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(in_RDI + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(in_RDI + 0x48));
  NaPetriNode::~NaPetriNode(in_RDI);
  return;
}

Assistant:

class PNNA_API NaPNComparator : public NaPetriNode
{
public:

    // Create the comparator node
    NaPNComparator (const char* szNodeName = "comparator");

    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ////////////////
    // Connectors //
    ////////////////

    // Dimensions of main and aux inputs must coinside

    // Mainstream input
    NaPetriCnInput      main;

    // Substractable input
    NaPetriCnInput      aux;

    // Dimension of output is equal to dimension of main input 

    // Mainstream output
    NaPetriCnOutput     cmp;


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

}